

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggx.cpp
# Opt level: O0

float __thiscall
ggx::evaluate(ggx *this,vec3 *light_dir,vec3 *view_dir,float *probability_density_function)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vec<3,_float,_(glm::precision)0> vVar4;
  float res;
  float ndf;
  float local_68;
  undefined8 local_60;
  float local_58;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_50;
  undefined1 local_40 [8];
  vec3 h;
  float g2;
  float *probability_density_function_local;
  vec3 *view_dir_local;
  vec3 *light_dir_local;
  ggx *this_local;
  
  if (0.0 < (view_dir->field_0).field_0.z) {
    unique0x10000239 = probability_density_function;
    h.field_0.field_0.y = calculate_shadow_masking_term(this,light_dir,view_dir);
    vVar4 = glm::operator+(view_dir,light_dir);
    local_58 = vVar4.field_0._8_4_;
    local_50.field_0.z = local_58;
    local_60 = vVar4.field_0._0_8_;
    local_50._0_8_ = local_60;
    vVar4 = glm::normalize<3,float,(glm::precision)0,glm::vec>
                      ((vec<3,_float,_(glm::precision)0> *)&local_50.field_0);
    _res = vVar4.field_0._0_8_;
    local_40 = (undefined1  [8])_res;
    local_68 = vVar4.field_0._8_4_;
    h.field_0.field_0.x = local_68;
    fVar1 = calculateNDF(this,(vec3 *)local_40);
    fVar2 = fVar1 * h.field_0.field_0.x;
    fVar3 = glm::dot<3,float,(glm::precision)0>
                      (view_dir,(vec<3,_float,_(glm::precision)0> *)local_40);
    *stack0xffffffffffffffd0 = ABS((fVar2 / 4.0) / fVar3);
    this_local._4_4_ = ((fVar1 * h.field_0.field_0.y) / 4.0) / (view_dir->field_0).field_0.z;
  }
  else {
    *probability_density_function = 0.0;
    this_local._4_4_ = 0.0;
  }
  return this_local._4_4_;
}

Assistant:

float ggx::evaluate(
  const glm::vec3 &light_dir,
  const glm::vec3 &view_dir,
  float &probability_density_function
) const
{
  if (view_dir.z <= 0)
  {
    probability_density_function = 0;
    return 0;
  }

  float g2 = calculate_shadow_masking_term(light_dir, view_dir);

  const glm::vec3 h = glm::normalize(view_dir + light_dir);
  float ndf = calculateNDF(h);

  // Additional factor in the pdf (1/(4 dot(v,h))) is explained here:
  // - Microfacet Models for Refraction through Rough Surfaces
  // - Notes on the Ward BRDF, Bruce Walter
  probability_density_function = fabsf(ndf * h.z / 4.0f / glm::dot(view_dir, h));

  // We assume that Fresnel factor is equal to 1.
  float res = ndf * g2 / 4.0f / view_dir.z;

  return res;
}